

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void av1_highbd_dr_prediction_z3_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  int in_ECX;
  int in_EDX;
  int in_stack_00000064;
  int in_stack_0000006c;
  undefined4 in_stack_00000074;
  undefined4 in_stack_0000007c;
  uint16_t *in_stack_00000080;
  int in_stack_000000c4;
  int in_stack_000000c8;
  int in_stack_000000cc;
  uint16_t *in_stack_000000d0;
  ptrdiff_t in_stack_000000d8;
  uint16_t *in_stack_000000e0;
  int in_stack_000000fc;
  int in_stack_00000100;
  int in_stack_00000104;
  uint16_t *in_stack_00000108;
  ptrdiff_t in_stack_00000110;
  undefined4 in_stack_00000118;
  int in_stack_0000011c;
  int in_stack_00000120;
  int in_stack_00000124;
  uint16_t *in_stack_00000128;
  ptrdiff_t in_stack_00000130;
  uint16_t *in_stack_00000138;
  int in_stack_00000164;
  int in_stack_00000168;
  int in_stack_0000016c;
  uint16_t *in_stack_00000170;
  undefined4 in_stack_00000178;
  int in_stack_0000017c;
  int in_stack_00000180;
  int in_stack_00000184;
  uint16_t *in_stack_00000188;
  ptrdiff_t in_stack_00000190;
  uint16_t *in_stack_00000198;
  int in_stack_0000021c;
  int in_stack_00000220;
  int in_stack_00000224;
  uint16_t *in_stack_00000228;
  ptrdiff_t in_stack_00000230;
  uint16_t *in_stack_00000238;
  int in_stack_0000027c;
  int in_stack_00000280;
  int in_stack_00000284;
  uint16_t *in_stack_00000288;
  ptrdiff_t in_stack_00000290;
  uint16_t *in_stack_00000298;
  int in_stack_000003fc;
  int in_stack_00000400;
  int in_stack_00000404;
  uint16_t *in_stack_00000408;
  ptrdiff_t in_stack_00000410;
  uint16_t *in_stack_00000418;
  int in_stack_0000043c;
  int in_stack_00000440;
  int in_stack_00000444;
  uint16_t *in_stack_00000448;
  ptrdiff_t in_stack_00000450;
  uint16_t *in_stack_00000458;
  int in_stack_0000047c;
  int in_stack_00000480;
  int in_stack_00000484;
  uint16_t *in_stack_00000488;
  ptrdiff_t in_stack_00000490;
  uint16_t *in_stack_00000498;
  int in_stack_0000061c;
  int in_stack_00000620;
  int in_stack_00000624;
  uint16_t *in_stack_00000628;
  ptrdiff_t in_stack_00000630;
  uint16_t *in_stack_00000638;
  int in_stack_000007a4;
  int in_stack_000007a8;
  int in_stack_000007ac;
  uint16_t *in_stack_000007b0;
  ptrdiff_t in_stack_000007b8;
  uint16_t *in_stack_000007c0;
  int in_stack_0000083c;
  int in_stack_00000840;
  int in_stack_00000844;
  uint16_t *in_stack_00000848;
  ptrdiff_t in_stack_00000850;
  uint16_t *in_stack_00000858;
  int in_stack_00000a1c;
  int in_stack_00000a20;
  int in_stack_00000a24;
  uint16_t *in_stack_00000a28;
  ptrdiff_t in_stack_00000a30;
  undefined4 in_stack_00000a38;
  int in_stack_00000a3c;
  int in_stack_00000a40;
  int in_stack_00000a44;
  uint16_t *in_stack_00000a48;
  ptrdiff_t in_stack_00000a50;
  uint16_t *in_stack_00000a58;
  int in_stack_00000fa4;
  int in_stack_00000fa8;
  int in_stack_00000fac;
  undefined4 in_stack_00000fb0;
  int in_stack_00000fb4;
  int in_stack_00000fb8;
  int in_stack_00000fbc;
  uint16_t *in_stack_00000fc0;
  ptrdiff_t in_stack_00000fc8;
  uint16_t *in_stack_00000fd0;
  int in_stack_00001fa4;
  int in_stack_00001fa8;
  int in_stack_00001fac;
  uint16_t *in_stack_00001fb0;
  ptrdiff_t in_stack_00001fb8;
  uint16_t *in_stack_00001fc0;
  
  if (in_EDX == in_ECX) {
    if (in_EDX == 4) {
      highbd_dr_prediction_z3_4x4_avx2
                (in_stack_00000080,CONCAT44(in_stack_0000007c,bd),
                 (uint16_t *)CONCAT44(in_stack_00000074,dy),in_stack_0000006c,dx,in_stack_00000064);
    }
    else if (in_EDX == 8) {
      highbd_dr_prediction_z3_8x8_avx2
                (in_stack_00000198,in_stack_00000190,in_stack_00000188,in_stack_00000184,
                 in_stack_00000180,in_stack_0000017c);
    }
    else if (in_EDX == 0x10) {
      highbd_dr_prediction_z3_16x16_avx2
                (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000404,
                 in_stack_00000400,in_stack_000003fc);
    }
    else if (in_EDX == 0x20) {
      highbd_dr_prediction_z3_32x32_avx2
                (in_stack_00000a58,in_stack_00000a50,in_stack_00000a48,in_stack_00000a44,
                 in_stack_00000a40,in_stack_00000a3c);
    }
    else if (in_EDX == 0x40) {
      highbd_dr_prediction_z3_64x64_avx2
                (in_stack_00001fc0,in_stack_00001fb8,in_stack_00001fb0,in_stack_00001fac,
                 in_stack_00001fa8,in_stack_00001fa4);
    }
  }
  else if (in_EDX < in_ECX) {
    if (in_EDX * 2 == in_ECX) {
      switch(in_EDX) {
      case 4:
        highbd_dr_prediction_z3_4x8_avx2
                  ((uint16_t *)CONCAT44(in_stack_0000011c,in_stack_00000118),in_stack_00000110,
                   in_stack_00000108,in_stack_00000104,in_stack_00000100,in_stack_000000fc);
        break;
      case 8:
        highbd_dr_prediction_z3_8x16_avx2
                  (in_stack_00000238,in_stack_00000230,in_stack_00000228,in_stack_00000224,
                   in_stack_00000220,in_stack_0000021c);
        break;
      case 0x10:
        highbd_dr_prediction_z3_16x32_avx2
                  (in_stack_00000858,in_stack_00000850,in_stack_00000848,in_stack_00000844,
                   in_stack_00000840,in_stack_0000083c);
        break;
      case 0x20:
        highbd_dr_prediction_z3_32x64_avx2
                  (in_stack_00000fc0,CONCAT44(in_stack_00000fbc,in_stack_00000fb8),
                   (uint16_t *)CONCAT44(in_stack_00000fb4,in_stack_00000fb0),in_stack_00000fac,
                   in_stack_00000fa8,in_stack_00000fa4);
      }
    }
    else if (in_EDX == 4) {
      highbd_dr_prediction_z3_4x16_avx2
                (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124,
                 in_stack_00000120,in_stack_0000011c);
    }
    else if (in_EDX == 8) {
      highbd_dr_prediction_z3_8x32_avx2
                (in_stack_00000458,in_stack_00000450,in_stack_00000448,in_stack_00000444,
                 in_stack_00000440,in_stack_0000043c);
    }
    else if (in_EDX == 0x10) {
      highbd_dr_prediction_z3_16x64_avx2
                (in_stack_000007c0,in_stack_000007b8,in_stack_000007b0,in_stack_000007ac,
                 in_stack_000007a8,in_stack_000007a4);
    }
  }
  else if (in_ECX * 2 == in_EDX) {
    switch(in_ECX) {
    case 4:
      highbd_dr_prediction_z3_8x4_avx2
                (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,
                 in_stack_000000c8,in_stack_000000c4);
      break;
    case 8:
      highbd_dr_prediction_z3_16x8_avx2
                (in_stack_00000298,in_stack_00000290,in_stack_00000288,in_stack_00000284,
                 in_stack_00000280,in_stack_0000027c);
      break;
    case 0x10:
      highbd_dr_prediction_z3_32x16_avx2
                (in_stack_00000638,in_stack_00000630,in_stack_00000628,in_stack_00000624,
                 in_stack_00000620,in_stack_0000061c);
      break;
    case 0x20:
      highbd_dr_prediction_z3_64x32_avx2
                (in_stack_00000fd0,in_stack_00000fc8,in_stack_00000fc0,in_stack_00000fbc,
                 in_stack_00000fb8,in_stack_00000fb4);
    }
  }
  else if (in_ECX == 4) {
    highbd_dr_prediction_z3_16x4_avx2
              ((uint16_t *)CONCAT44(in_stack_00000184,in_stack_00000180),
               CONCAT44(in_stack_0000017c,in_stack_00000178),in_stack_00000170,in_stack_0000016c,
               in_stack_00000168,in_stack_00000164);
  }
  else if (in_ECX == 8) {
    highbd_dr_prediction_z3_32x8_avx2
              (in_stack_00000498,in_stack_00000490,in_stack_00000488,in_stack_00000484,
               in_stack_00000480,in_stack_0000047c);
  }
  else if (in_ECX == 0x10) {
    highbd_dr_prediction_z3_64x16_avx2
              ((uint16_t *)CONCAT44(in_stack_00000a3c,in_stack_00000a38),in_stack_00000a30,
               in_stack_00000a28,in_stack_00000a24,in_stack_00000a20,in_stack_00000a1c);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z3_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_left,
                                      int dx, int dy, int bd) {
  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);
  if (bw == bh) {
    switch (bw) {
      case 4:
        highbd_dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 8:
        highbd_dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 16:
        highbd_dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 32:
        highbd_dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 64:
        highbd_dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            highbd_dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            highbd_dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
  return;
}